

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O1

_Bool av1_resize_vert_dir_avx2
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int stride,
                int start_col)

{
  int iVar1;
  _Bool _Var2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  int iVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint8_t *puVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 local_d8 [32];
  
  auVar40 = in_ZMM3._32_32_;
  if (7 < height && (height & 1U) == 0) {
    uVar9 = stride + 0xf;
    if (-1 < stride) {
      uVar9 = stride;
    }
    iVar8 = stride % 0x10;
    iVar4 = (height & 2U) + 4;
    if (start_col < (int)(uVar9 & 0xfffffff0)) {
      lVar11 = (long)stride;
      uVar15 = height - iVar4;
      iVar5 = height + -1;
      lVar14 = (long)iVar5;
      lVar3 = (long)start_col;
      pauVar12 = (undefined1 (*) [16])(output + lVar3);
      do {
        auVar25 = *(undefined1 (*) [16])(intbuf + lVar3);
        auVar21 = *(undefined1 (*) [16])(intbuf + lVar11 + lVar3);
        auVar20 = *(undefined1 (*) [16])(intbuf + lVar11 * 2 + lVar3);
        auVar24 = *(undefined1 (*) [16])(intbuf + lVar11 * 3 + lVar3);
        auVar39 = ZEXT1664(auVar24);
        auVar30 = *(undefined1 (*) [16])(intbuf + lVar11 * 4 + lVar3);
        auVar45 = ZEXT1664(auVar30);
        auVar42._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar25;
        auVar42._16_16_ = ZEXT116(1) * auVar21;
        auVar22._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar25;
        auVar22._16_16_ = ZEXT116(1) * auVar20;
        auVar38._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar21;
        auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
        auVar33._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar20;
        auVar33._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
        auVar21 = vpunpcklbw_avx(auVar25,auVar25);
        auVar40 = vpermq_avx2(ZEXT1632(auVar21),0x44);
        auVar71 = ZEXT3264(auVar40);
        auVar29 = vpunpcklbw_avx2(auVar42,auVar22);
        auVar40 = vpunpcklbw_avx2(auVar38,auVar33);
        auVar25 = vpunpckhbw_avx(auVar25,auVar25);
        auVar55 = vpermq_avx2(ZEXT1632(auVar25),0x44);
        auVar42 = vpunpckhbw_avx2(auVar42,auVar22);
        local_d8 = vpunpckhbw_avx2(auVar38,auVar33);
        if (0 < (int)uVar15) {
          uVar18 = 0;
          pauVar7 = pauVar12;
          auVar22 = auVar29;
          auVar33 = auVar40;
          auVar38 = auVar42;
          auVar41 = auVar55;
          do {
            auVar55 = local_d8;
            iVar13 = (int)uVar18;
            iVar1 = iVar13 + 5;
            if (iVar5 < iVar13 + 5) {
              iVar1 = iVar5;
            }
            iVar10 = iVar13 + 6;
            if (iVar5 < iVar13 + 6) {
              iVar10 = iVar5;
            }
            auVar25 = *(undefined1 (*) [16])(intbuf + iVar1 * stride + lVar3);
            auVar21 = *(undefined1 (*) [16])(intbuf + iVar10 * stride + lVar3);
            auVar40._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar39._0_16_;
            auVar40._16_16_ = ZEXT116(0) * auVar39._16_16_ + ZEXT116(1) * auVar25;
            auVar36._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar45._0_16_;
            auVar36._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar21;
            auVar29 = vpunpcklbw_avx2(auVar40,auVar36);
            auVar42 = vpunpckhbw_avx2(auVar40,auVar36);
            auVar37._8_2_ = 0xfdff;
            auVar37._0_8_ = 0xfdfffdfffdfffdff;
            auVar37._10_2_ = 0xfdff;
            auVar37._12_2_ = 0xfdff;
            auVar37._14_2_ = 0xfdff;
            auVar37._16_2_ = 0xfdff;
            auVar37._18_2_ = 0xfdff;
            auVar37._20_2_ = 0xfdff;
            auVar37._22_2_ = 0xfdff;
            auVar37._24_2_ = 0xfdff;
            auVar37._26_2_ = 0xfdff;
            auVar37._28_2_ = 0xfdff;
            auVar37._30_2_ = 0xfdff;
            auVar44._8_2_ = 0x380c;
            auVar44._0_8_ = 0x380c380c380c380c;
            auVar44._10_2_ = 0x380c;
            auVar44._12_2_ = 0x380c;
            auVar44._14_2_ = 0x380c;
            auVar44._16_2_ = 0x380c;
            auVar44._18_2_ = 0x380c;
            auVar44._20_2_ = 0x380c;
            auVar44._22_2_ = 0x380c;
            auVar44._24_2_ = 0x380c;
            auVar44._26_2_ = 0x380c;
            auVar44._28_2_ = 0x380c;
            auVar44._30_2_ = 0x380c;
            auVar40 = vpmaddubsw_avx2(auVar71._0_32_,auVar37);
            auVar22 = vpmaddubsw_avx2(auVar22,auVar44);
            auVar65._8_2_ = 0xc38;
            auVar65._0_8_ = 0xc380c380c380c38;
            auVar65._10_2_ = 0xc38;
            auVar65._12_2_ = 0xc38;
            auVar65._14_2_ = 0xc38;
            auVar65._16_2_ = 0xc38;
            auVar65._18_2_ = 0xc38;
            auVar65._20_2_ = 0xc38;
            auVar65._22_2_ = 0xc38;
            auVar65._24_2_ = 0xc38;
            auVar65._26_2_ = 0xc38;
            auVar65._28_2_ = 0xc38;
            auVar65._30_2_ = 0xc38;
            auVar40 = vpaddw_avx2(auVar22,auVar40);
            auVar22 = vpmaddubsw_avx2(auVar33,auVar65);
            auVar67._8_2_ = 0xfffd;
            auVar67._0_8_ = 0xfffdfffdfffdfffd;
            auVar67._10_2_ = 0xfffd;
            auVar67._12_2_ = 0xfffd;
            auVar67._14_2_ = 0xfffd;
            auVar67._16_2_ = 0xfffd;
            auVar67._18_2_ = 0xfffd;
            auVar67._20_2_ = 0xfffd;
            auVar67._22_2_ = 0xfffd;
            auVar67._24_2_ = 0xfffd;
            auVar67._26_2_ = 0xfffd;
            auVar67._28_2_ = 0xfffd;
            auVar67._30_2_ = 0xfffd;
            auVar36 = vpmaddubsw_avx2(auVar29,auVar67);
            auVar22 = vpaddw_avx2(auVar36,auVar22);
            auVar69._8_4_ = 0x40;
            auVar69._0_8_ = 0x4000000040;
            auVar69._12_4_ = 0x40;
            auVar69._16_4_ = 0x40;
            auVar69._20_4_ = 0x40;
            auVar69._24_4_ = 0x40;
            auVar69._28_4_ = 0x40;
            auVar36 = vpmovsxwd_avx2(auVar40._0_16_);
            auVar36 = vpaddd_avx2(auVar36,auVar69);
            auVar34 = vpmovsxwd_avx2(auVar22._0_16_);
            auVar36 = vpaddd_avx2(auVar36,auVar34);
            auVar40 = vpmovsxwd_avx2(auVar40._16_16_);
            auVar22 = vpmovsxwd_avx2(auVar22._16_16_);
            auVar40 = vpaddd_avx2(auVar69,auVar40);
            auVar40 = vpaddd_avx2(auVar40,auVar22);
            auVar22 = vpsrad_avx2(auVar36,7);
            auVar40 = vpsrad_avx2(auVar40,7);
            auVar40 = vpackusdw_avx2(auVar22,auVar40);
            auVar22 = vpmaddubsw_avx2(auVar41,auVar37);
            auVar38 = vpmaddubsw_avx2(auVar38,auVar44);
            auVar38 = vpaddw_avx2(auVar38,auVar22);
            auVar22 = vpmaddubsw_avx2(auVar55,auVar65);
            auVar41 = vpmaddubsw_avx2(auVar42,auVar67);
            auVar22 = vpaddw_avx2(auVar41,auVar22);
            auVar41 = vpmovsxwd_avx2(auVar38._0_16_);
            auVar36 = vpmovsxwd_avx2(auVar38._16_16_);
            auVar34 = vpmovsxwd_avx2(auVar22._0_16_);
            auVar37 = vpmovsxwd_avx2(auVar22._16_16_);
            auVar38 = vpaddd_avx2(auVar69,auVar41);
            auVar38 = vpaddd_avx2(auVar34,auVar38);
            auVar22 = vpaddd_avx2(auVar69,auVar36);
            auVar22 = vpaddd_avx2(auVar22,auVar37);
            auVar41 = vpsrad_avx2(auVar38,7);
            auVar38 = vpsrad_avx2(auVar22,7);
            auVar38 = vpackusdw_avx2(auVar41,auVar38);
            auVar40 = vpermq_avx2(auVar40,0xd8);
            auVar38 = vpermq_avx2(auVar38,0xd8);
            auVar40 = vpackuswb_avx2(auVar40,auVar38);
            *pauVar7 = auVar40._0_16_;
            *(undefined1 (*) [16])(*pauVar7 + out_stride) = auVar40._16_16_;
            iVar1 = iVar13 + 7;
            if (iVar5 < iVar13 + 7) {
              iVar1 = iVar5;
            }
            iVar10 = iVar13 + 8;
            if (iVar5 < iVar13 + 8) {
              iVar10 = iVar5;
            }
            auVar20 = *(undefined1 (*) [16])(intbuf + iVar1 * stride + lVar3);
            auVar39 = ZEXT1664(auVar20);
            auVar24 = *(undefined1 (*) [16])(intbuf + iVar10 * stride + lVar3);
            auVar45 = ZEXT1664(auVar24);
            auVar41._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar25;
            auVar41._16_16_ = ZEXT116(1) * auVar20;
            auVar34._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar21;
            auVar34._16_16_ = ZEXT116(1) * auVar24;
            auVar40 = vpunpcklbw_avx2(auVar41,auVar34);
            local_d8 = vpunpckhbw_avx2(auVar41,auVar34);
            uVar18 = uVar18 + 4;
            pauVar7 = (undefined1 (*) [16])(*pauVar7 + (long)out_stride * 2);
            auVar71 = ZEXT3264(auVar33);
            auVar22 = auVar29;
            auVar33 = auVar40;
            auVar38 = auVar42;
            auVar41 = auVar55;
          } while (uVar18 < uVar15);
        }
        auVar35 = ZEXT3264(auVar40);
        auVar40 = auVar39._32_32_;
        auVar51 = ZEXT3264(auVar42);
        auVar48 = ZEXT3264(auVar55);
        uVar18 = (ulong)(height & 0x7ffffffc) - 2;
        if ((int)uVar15 < iVar5) {
          do {
            iVar13 = (int)uVar18;
            iVar1 = iVar13 + 3;
            if (iVar5 < iVar13 + 3) {
              iVar1 = iVar5;
            }
            iVar10 = iVar13 + 4;
            if (iVar5 < iVar13 + 4) {
              iVar10 = iVar5;
            }
            auVar25 = *(undefined1 (*) [16])(intbuf + iVar1 * stride + lVar3);
            auVar21 = *(undefined1 (*) [16])(intbuf + iVar10 * stride + lVar3);
            auVar55._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar39._0_16_;
            auVar55._16_16_ = ZEXT116(0) * auVar39._16_16_ + ZEXT116(1) * auVar25;
            auVar20 = auVar45._0_16_;
            auVar60._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar20;
            auVar60._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar21;
            auVar41 = vpunpcklbw_avx2(auVar55,auVar60);
            auVar66._8_2_ = 0xfdff;
            auVar66._0_8_ = 0xfdfffdfffdfffdff;
            auVar66._10_2_ = 0xfdff;
            auVar66._12_2_ = 0xfdff;
            auVar66._14_2_ = 0xfdff;
            auVar66._16_2_ = 0xfdff;
            auVar66._18_2_ = 0xfdff;
            auVar66._20_2_ = 0xfdff;
            auVar66._22_2_ = 0xfdff;
            auVar66._24_2_ = 0xfdff;
            auVar66._26_2_ = 0xfdff;
            auVar66._28_2_ = 0xfdff;
            auVar66._30_2_ = 0xfdff;
            auVar22 = vpunpckhbw_avx2(auVar55,auVar60);
            auVar36 = auVar71._0_32_;
            auVar40 = vpmaddubsw_avx2(auVar36,auVar66);
            auVar68._8_2_ = 0x380c;
            auVar68._0_8_ = 0x380c380c380c380c;
            auVar68._10_2_ = 0x380c;
            auVar68._12_2_ = 0x380c;
            auVar68._14_2_ = 0x380c;
            auVar68._16_2_ = 0x380c;
            auVar68._18_2_ = 0x380c;
            auVar68._20_2_ = 0x380c;
            auVar68._22_2_ = 0x380c;
            auVar68._24_2_ = 0x380c;
            auVar68._26_2_ = 0x380c;
            auVar68._28_2_ = 0x380c;
            auVar68._30_2_ = 0x380c;
            auVar42 = vpmaddubsw_avx2(auVar29,auVar68);
            auVar40 = vpaddw_avx2(auVar42,auVar40);
            auVar70._8_2_ = 0xc38;
            auVar70._0_8_ = 0xc380c380c380c38;
            auVar70._10_2_ = 0xc38;
            auVar70._12_2_ = 0xc38;
            auVar70._14_2_ = 0xc38;
            auVar70._16_2_ = 0xc38;
            auVar70._18_2_ = 0xc38;
            auVar70._20_2_ = 0xc38;
            auVar70._22_2_ = 0xc38;
            auVar70._24_2_ = 0xc38;
            auVar70._26_2_ = 0xc38;
            auVar70._28_2_ = 0xc38;
            auVar70._30_2_ = 0xc38;
            auVar34 = auVar35._0_32_;
            auVar42 = vpmaddubsw_avx2(auVar34,auVar70);
            auVar54._8_2_ = 0xfffd;
            auVar54._0_8_ = 0xfffdfffdfffdfffd;
            auVar54._10_2_ = 0xfffd;
            auVar54._12_2_ = 0xfffd;
            auVar54._14_2_ = 0xfffd;
            auVar54._16_2_ = 0xfffd;
            auVar54._18_2_ = 0xfffd;
            auVar54._20_2_ = 0xfffd;
            auVar54._22_2_ = 0xfffd;
            auVar54._24_2_ = 0xfffd;
            auVar54._26_2_ = 0xfffd;
            auVar54._28_2_ = 0xfffd;
            auVar54._30_2_ = 0xfffd;
            auVar55 = vpmaddubsw_avx2(auVar41,auVar54);
            auVar42 = vpaddw_avx2(auVar55,auVar42);
            auVar55 = vpmovsxwd_avx2(auVar40._0_16_);
            auVar63._8_4_ = 0x40;
            auVar63._0_8_ = 0x4000000040;
            auVar63._12_4_ = 0x40;
            auVar63._16_4_ = 0x40;
            auVar63._20_4_ = 0x40;
            auVar63._24_4_ = 0x40;
            auVar63._28_4_ = 0x40;
            auVar38 = vpmovsxwd_avx2(auVar42._0_16_);
            auVar55 = vpaddd_avx2(auVar55,auVar63);
            auVar55 = vpaddd_avx2(auVar55,auVar38);
            auVar40 = vpmovsxwd_avx2(auVar40._16_16_);
            auVar42 = vpmovsxwd_avx2(auVar42._16_16_);
            auVar40 = vpaddd_avx2(auVar63,auVar40);
            auVar40 = vpaddd_avx2(auVar42,auVar40);
            auVar42 = vpsrad_avx2(auVar55,7);
            auVar40 = vpsrad_avx2(auVar40,7);
            auVar40 = vpackusdw_avx2(auVar42,auVar40);
            auVar42 = vpmaddubsw_avx2(auVar48._0_32_,auVar66);
            auVar55 = vpmaddubsw_avx2(auVar51._0_32_,auVar68);
            auVar42 = vpaddw_avx2(auVar55,auVar42);
            auVar55 = vpmaddubsw_avx2(local_d8,auVar70);
            auVar38 = vpmaddubsw_avx2(auVar22,auVar54);
            auVar55 = vpaddw_avx2(auVar38,auVar55);
            auVar38 = vpmovsxwd_avx2(auVar42._0_16_);
            auVar33 = vpmovsxwd_avx2(auVar55._0_16_);
            auVar38 = vpaddd_avx2(auVar38,auVar63);
            auVar38 = vpaddd_avx2(auVar38,auVar33);
            auVar42 = vpmovsxwd_avx2(auVar42._16_16_);
            auVar42 = vpaddd_avx2(auVar63,auVar42);
            auVar55 = vpmovsxwd_avx2(auVar55._16_16_);
            auVar42 = vpaddd_avx2(auVar55,auVar42);
            auVar55 = vpsrad_avx2(auVar38,7);
            auVar42 = vpsrad_avx2(auVar42,7);
            auVar42 = vpackusdw_avx2(auVar55,auVar42);
            auVar40 = vpermq_avx2(auVar40,0xd8);
            auVar42 = vpermq_avx2(auVar42,0xd8);
            auVar40 = vpackuswb_avx2(auVar40,auVar42);
            *(undefined1 (*) [16])(output + (int)((iVar13 - 2U >> 1) * out_stride) + lVar3) =
                 auVar40._0_16_;
            if ((long)uVar18 < lVar14) {
              *(undefined1 (*) [16])
               (output + (int)(((uint)(uVar18 >> 1) & 0x7fffffff) * out_stride) + lVar3) =
                   auVar40._16_16_;
            }
            lVar19 = uVar18 + 2;
            if (lVar19 < lVar14) {
              auVar20 = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar25;
              auVar24 = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar21;
              auVar29._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar20;
              auVar29._16_16_ = ZEXT116(0) * ZEXT116(1) * auVar25 + ZEXT116(1) * auVar24;
              auVar28._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar21;
              auVar28._16_16_ = ZEXT116(1) * auVar21;
              auVar40 = vpunpcklbw_avx2(auVar29,auVar28);
              auVar35 = ZEXT3264(auVar40);
              auVar48 = ZEXT3264(local_d8);
              local_d8 = vpunpckhbw_avx2(auVar29,auVar28);
              auVar39 = ZEXT1664(auVar21);
              auVar51 = ZEXT3264(auVar22);
              auVar29 = auVar41;
              auVar20 = auVar21;
              auVar36 = auVar34;
            }
            auVar40 = auVar39._32_32_;
            auVar71 = ZEXT3264(auVar36);
            auVar45 = ZEXT1664(auVar20);
            uVar18 = uVar18 + 4;
          } while (lVar19 < lVar14);
        }
        lVar3 = lVar3 + 0x10;
        pauVar12 = pauVar12 + 1;
      } while (lVar3 < (int)(uVar9 & 0xfffffff0));
    }
    if (7 < iVar8) {
      lVar3 = (long)((int)uVar9 >> 4) * 0x10;
      lVar11 = (long)stride;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(intbuf + lVar11 + lVar3);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(intbuf + lVar11 * 2 + lVar3);
      auVar25 = vpunpcklbw_avx(auVar25,auVar24);
      auVar45 = ZEXT864(*(ulong *)(intbuf + lVar11 * 3 + lVar3));
      auVar71 = ZEXT864(*(ulong *)(intbuf + lVar11 * 4 + lVar3));
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(intbuf + lVar3);
      auVar21 = vpunpcklbw_avx(auVar21,auVar21);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(intbuf + lVar11 * 3 + lVar3);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(intbuf + lVar11 * 4 + lVar3);
      auVar20 = vpunpcklbw_avx(auVar20,auVar30);
      auVar35._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar21;
      auVar35._16_16_ = ZEXT116(1) * auVar21;
      auVar35._32_32_ = auVar40;
      auVar39 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                    ZEXT116(1) * auVar25,ZEXT116(0) * auVar25 + ZEXT116(1) * auVar21
                                   ));
      auVar43._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar25;
      auVar43._16_16_ = ZEXT116(1) * auVar20;
      uVar9 = height - iVar4;
      uVar18 = (ulong)uVar9;
      iVar5 = (int)lVar3;
      if (uVar9 != 0 && iVar4 <= height) {
        iVar4 = height + -1;
        puVar17 = output + iVar5;
        uVar16 = 0;
        auVar46._8_2_ = 0xfdff;
        auVar46._0_8_ = 0xfdfffdfffdfffdff;
        auVar46._10_2_ = 0xfdff;
        auVar46._12_2_ = 0xfdff;
        auVar46._14_2_ = 0xfdff;
        auVar46._16_2_ = 0xfdff;
        auVar46._18_2_ = 0xfdff;
        auVar46._20_2_ = 0xfdff;
        auVar46._22_2_ = 0xfdff;
        auVar46._24_2_ = 0xfdff;
        auVar46._26_2_ = 0xfdff;
        auVar46._28_2_ = 0xfdff;
        auVar46._30_2_ = 0xfdff;
        auVar49._8_2_ = 0x380c;
        auVar49._0_8_ = 0x380c380c380c380c;
        auVar49._10_2_ = 0x380c;
        auVar49._12_2_ = 0x380c;
        auVar49._14_2_ = 0x380c;
        auVar49._16_2_ = 0x380c;
        auVar49._18_2_ = 0x380c;
        auVar49._20_2_ = 0x380c;
        auVar49._22_2_ = 0x380c;
        auVar49._24_2_ = 0x380c;
        auVar49._26_2_ = 0x380c;
        auVar49._28_2_ = 0x380c;
        auVar49._30_2_ = 0x380c;
        auVar52._8_2_ = 0xc38;
        auVar52._0_8_ = 0xc380c380c380c38;
        auVar52._10_2_ = 0xc38;
        auVar52._12_2_ = 0xc38;
        auVar52._14_2_ = 0xc38;
        auVar52._16_2_ = 0xc38;
        auVar52._18_2_ = 0xc38;
        auVar52._20_2_ = 0xc38;
        auVar52._22_2_ = 0xc38;
        auVar52._24_2_ = 0xc38;
        auVar52._26_2_ = 0xc38;
        auVar52._28_2_ = 0xc38;
        auVar52._30_2_ = 0xc38;
        auVar56._8_2_ = 0xfffd;
        auVar56._0_8_ = 0xfffdfffdfffdfffd;
        auVar56._10_2_ = 0xfffd;
        auVar56._12_2_ = 0xfffd;
        auVar56._14_2_ = 0xfffd;
        auVar56._16_2_ = 0xfffd;
        auVar56._18_2_ = 0xfffd;
        auVar56._20_2_ = 0xfffd;
        auVar56._22_2_ = 0xfffd;
        auVar56._24_2_ = 0xfffd;
        auVar56._26_2_ = 0xfffd;
        auVar56._28_2_ = 0xfffd;
        auVar56._30_2_ = 0xfffd;
        auVar61._8_4_ = 0x40;
        auVar61._0_8_ = 0x4000000040;
        auVar61._12_4_ = 0x40;
        auVar61._16_4_ = 0x40;
        auVar61._20_4_ = 0x40;
        auVar61._24_4_ = 0x40;
        auVar61._28_4_ = 0x40;
        auVar40 = auVar43;
        do {
          auVar29 = vpmaddubsw_avx2(auVar39._0_32_,auVar49);
          auVar42 = vpmaddubsw_avx2(auVar35._0_32_,auVar46);
          auVar29 = vpaddw_avx2(auVar29,auVar42);
          auVar25 = vpunpcklbw_avx(auVar45._0_16_,auVar71._0_16_);
          iVar8 = (int)uVar16;
          iVar13 = iVar8 + 5;
          if (iVar4 < iVar8 + 5) {
            iVar13 = iVar4;
          }
          iVar1 = iVar8 + 6;
          if (iVar4 < iVar8 + 6) {
            iVar1 = iVar4;
          }
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(intbuf + iVar13 * stride + lVar3);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(intbuf + iVar1 * stride + lVar3);
          auVar21 = vpunpcklbw_avx(auVar26,auVar31);
          auVar23._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar25;
          auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21;
          auVar39 = ZEXT3264(auVar23);
          auVar42 = vpmaddubsw_avx2(auVar40,auVar52);
          auVar55 = vpmaddubsw_avx2(auVar23,auVar56);
          auVar42 = vpaddw_avx2(auVar55,auVar42);
          auVar55 = vpmovsxwd_avx2(auVar29._0_16_);
          auVar38 = vpmovsxwd_avx2(auVar29._16_16_);
          auVar33 = vpmovsxwd_avx2(auVar42._0_16_);
          auVar22 = vpmovsxwd_avx2(auVar42._16_16_);
          auVar29 = vpaddd_avx2(auVar61,auVar55);
          auVar29 = vpaddd_avx2(auVar33,auVar29);
          auVar42 = vpaddd_avx2(auVar61,auVar38);
          auVar42 = vpaddd_avx2(auVar42,auVar22);
          auVar55 = vpsrad_avx2(auVar29,7);
          auVar29 = vpsrad_avx2(auVar42,7);
          auVar29 = vpackusdw_avx2(auVar55,auVar29);
          auVar29 = vpermq_avx2(auVar29,0xd8);
          auVar29 = vpackuswb_avx2(auVar29,auVar23);
          *(long *)puVar17 = auVar29._0_8_;
          *(long *)(puVar17 + out_stride) = auVar29._16_8_;
          iVar13 = iVar8 + 7;
          if (iVar4 < iVar8 + 7) {
            iVar13 = iVar4;
          }
          iVar1 = iVar8 + 8;
          if (iVar4 < iVar8 + 8) {
            iVar1 = iVar4;
          }
          auVar45 = ZEXT864(*(ulong *)(intbuf + iVar13 * stride + lVar3));
          auVar71 = ZEXT864(*(ulong *)(intbuf + iVar1 * stride + lVar3));
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(intbuf + iVar13 * stride + lVar3);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(intbuf + iVar1 * stride + lVar3);
          auVar25 = vpunpcklbw_avx(auVar27,auVar32);
          auVar43._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar21;
          auVar43._16_16_ = ZEXT116(1) * auVar25;
          uVar16 = uVar16 + 4;
          puVar17 = puVar17 + (long)out_stride * 2;
          auVar35 = ZEXT3264(auVar40);
          auVar40 = auVar43;
        } while (uVar16 < uVar18);
      }
      iVar8 = stride % 8;
      iVar4 = height + -1;
      if ((int)uVar9 < iVar4) {
        lVar11 = (long)iVar4;
        iVar13 = height - (height & 2U);
        lVar14 = 0;
        auVar47._8_2_ = 0x380c;
        auVar47._0_8_ = 0x380c380c380c380c;
        auVar47._10_2_ = 0x380c;
        auVar47._12_2_ = 0x380c;
        auVar47._14_2_ = 0x380c;
        auVar47._16_2_ = 0x380c;
        auVar47._18_2_ = 0x380c;
        auVar47._20_2_ = 0x380c;
        auVar47._22_2_ = 0x380c;
        auVar47._24_2_ = 0x380c;
        auVar47._26_2_ = 0x380c;
        auVar47._28_2_ = 0x380c;
        auVar47._30_2_ = 0x380c;
        auVar50._8_2_ = 0xc38;
        auVar50._0_8_ = 0xc380c380c380c38;
        auVar50._10_2_ = 0xc38;
        auVar50._12_2_ = 0xc38;
        auVar50._14_2_ = 0xc38;
        auVar50._16_2_ = 0xc38;
        auVar50._18_2_ = 0xc38;
        auVar50._20_2_ = 0xc38;
        auVar50._22_2_ = 0xc38;
        auVar50._24_2_ = 0xc38;
        auVar50._26_2_ = 0xc38;
        auVar50._28_2_ = 0xc38;
        auVar50._30_2_ = 0xc38;
        auVar53._8_2_ = 0xfffd;
        auVar53._0_8_ = 0xfffdfffdfffdfffd;
        auVar53._10_2_ = 0xfffd;
        auVar53._12_2_ = 0xfffd;
        auVar53._14_2_ = 0xfffd;
        auVar53._16_2_ = 0xfffd;
        auVar53._18_2_ = 0xfffd;
        auVar53._20_2_ = 0xfffd;
        auVar53._22_2_ = 0xfffd;
        auVar53._24_2_ = 0xfffd;
        auVar53._26_2_ = 0xfffd;
        auVar53._28_2_ = 0xfffd;
        auVar53._30_2_ = 0xfffd;
        auVar57._8_4_ = 0x40;
        auVar57._0_8_ = 0x4000000040;
        auVar57._12_4_ = 0x40;
        auVar57._16_4_ = 0x40;
        auVar57._20_4_ = 0x40;
        auVar57._24_4_ = 0x40;
        auVar57._28_4_ = 0x40;
        auVar48 = ZEXT3264(auVar43);
        do {
          iVar1 = (int)lVar14;
          iVar10 = iVar13 + iVar1 + 1;
          if (iVar4 < iVar10) {
            iVar10 = iVar4;
          }
          iVar6 = iVar13 + iVar1 + 2;
          if (iVar4 < iVar6) {
            iVar6 = iVar4;
          }
          uVar16 = *(ulong *)(intbuf + iVar6 * stride + lVar3);
          auVar25 = vpunpcklbw_avx(auVar45._0_16_,auVar71._0_16_);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar16;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(intbuf + iVar10 * stride + lVar3);
          auVar21 = vpunpcklbw_avx(auVar62,auVar58);
          auVar64._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar25;
          auVar64._16_16_ = ZEXT116(1) * auVar21;
          auVar40 = vpmaddubsw_avx2(auVar35._0_32_,_DAT_005642a0);
          auVar29 = vpmaddubsw_avx2(auVar39._0_32_,auVar47);
          auVar40 = vpaddw_avx2(auVar29,auVar40);
          auVar29 = vpmaddubsw_avx2(auVar48._0_32_,auVar50);
          auVar42 = vpmaddubsw_avx2(auVar64,auVar53);
          auVar29 = vpaddw_avx2(auVar42,auVar29);
          auVar42 = vpmovsxwd_avx2(auVar40._0_16_);
          auVar55 = vpmovsxwd_avx2(auVar29._0_16_);
          auVar42 = vpaddd_avx2(auVar42,auVar57);
          auVar42 = vpaddd_avx2(auVar42,auVar55);
          auVar40 = vpmovsxwd_avx2(auVar40._16_16_);
          auVar29 = vpmovsxwd_avx2(auVar29._16_16_);
          auVar40 = vpaddd_avx2(auVar40,auVar57);
          auVar40 = vpaddd_avx2(auVar40,auVar29);
          auVar29 = vpsrad_avx2(auVar42,7);
          auVar40 = vpsrad_avx2(auVar40,7);
          auVar40 = vpackusdw_avx2(auVar29,auVar40);
          auVar40 = vpermq_avx2(auVar40,0xd8);
          auVar40 = vpackuswb_avx2(auVar40,auVar39._0_32_);
          *(long *)(output + (int)(((uint)(uVar18 + lVar14 >> 1) & 0x7fffffff) * out_stride + iVar5)
                   ) = auVar40._0_8_;
          if ((long)(uVar18 + lVar14 + 2) < lVar11) {
            *(long *)(output + (int)(((uint)(iVar13 + -2 + iVar1) >> 1) * out_stride + iVar5)) =
                 auVar40._16_8_;
          }
          lVar19 = uVar18 + lVar14 + 4;
          auVar51 = auVar48;
          if (lVar19 < lVar11) {
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar16;
            auVar25 = vpunpcklbw_avx(auVar58,auVar59);
            auVar35 = ZEXT3264(auVar48._0_32_);
            auVar51._0_16_ =
                 ZEXT116(0) * auVar25 +
                 ZEXT116(1) * (ZEXT116(0) * auVar39._0_16_ + ZEXT116(1) * auVar21);
            auVar51._32_32_ = auVar48._32_32_;
            auVar51._16_16_ = ZEXT116(0) * ZEXT116(1) * auVar39._0_16_ + ZEXT116(1) * auVar25;
            auVar71 = ZEXT1664(auVar59);
            auVar45 = ZEXT1664(auVar59);
            auVar39 = ZEXT3264(auVar64);
          }
          lVar14 = lVar14 + 4;
          auVar48 = auVar51;
        } while (lVar19 < lVar11);
      }
    }
    if (iVar8 == 0) {
      return true;
    }
    start_col = stride - iVar8;
  }
  _Var2 = av1_resize_vert_dir_c(intbuf,output,out_stride,height,height2,stride,start_col);
  return _Var2;
}

Assistant:

bool av1_resize_vert_dir_avx2(uint8_t *intbuf, uint8_t *output, int out_stride,
                              int height, int height2, int stride,
                              int start_col) {
  assert(start_col <= stride);
  // For the GM tool, the input layer height or width is assured to be an even
  // number. Hence the function 'down2_symodd()' is not invoked and SIMD
  // optimization of the same is not implemented.
  // When the input height is less than 8 and even, the potential input
  // heights are limited to 2, 4, or 6. These scenarios require seperate
  // handling due to padding requirements. Invoking the C function here will
  // eliminate the need for conditional statements within the subsequent SIMD
  // code to manage these cases.
  if (height & 1 || height < 8) {
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, start_col);
  }

  __m256i s[10], coeffs_y[4];
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const uint8_t max_pixel = 255;
  const __m256i clip_pixel = _mm256_set1_epi8((char)max_pixel);
  const __m256i zero = _mm256_setzero_si256();

  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_y);

  const int num_col16 = stride / 16;
  int remain_col = stride % 16;
  // The core vertical SIMD processes 4 input rows simultaneously to generate
  // output corresponding to 2 rows. To streamline the core loop and eliminate
  // the need for conditional checks, the remaining rows (4 or 6) are processed
  // separately.
  const int remain_row = (height % 4 == 0) ? 4 : 6;

  for (int j = start_col; j < stride - remain_col; j += 16) {
    const uint8_t *data = &intbuf[j];
    const __m128i l3 = _mm_loadu_si128((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with the last available row at the top.
    const __m128i l0 = l3;
    const __m128i l1 = l3;
    const __m128i l2 = l3;
    const __m128i l4 = _mm_loadu_si128((__m128i *)(data + 1 * stride));

    __m128i l6, l7, l8, l9;
    __m128i l5 = _mm_loadu_si128((__m128i *)(data + 2 * stride));
    __m128i l10 = _mm_loadu_si128((__m128i *)(data + 3 * stride));
    __m128i l11 = _mm_loadu_si128((__m128i *)(data + 4 * stride));

    // a0...a15 | c0...c15
    const __m256i s02 =
        _mm256_permute2x128_si256(CAST_HI(l0), CAST_HI(l2), 0x20);
    // b0...b15 | d0...d15
    const __m256i s13 =
        _mm256_permute2x128_si256(CAST_HI(l1), CAST_HI(l3), 0x20);
    // c0...c15 | e0...e15
    const __m256i s24 =
        _mm256_permute2x128_si256(CAST_HI(l2), CAST_HI(l4), 0x20);
    // d0...d15 | f0...f15
    const __m256i s35 =
        _mm256_permute2x128_si256(CAST_HI(l3), CAST_HI(l5), 0x20);
    // e0...e15 | g0...g15
    const __m256i s46 =
        _mm256_permute2x128_si256(CAST_HI(l4), CAST_HI(l10), 0x20);
    // f0...f15 | h0...h15
    const __m256i s57 =
        _mm256_permute2x128_si256(CAST_HI(l5), CAST_HI(l11), 0x20);

    // a0b0...a7b7 | c0d0...c7d7
    s[0] = _mm256_unpacklo_epi8(s02, s13);
    // c0d0...c7d7 | e0f0...e7f7
    s[1] = _mm256_unpacklo_epi8(s24, s35);
    // e0f0...e7f7 | g0h0...g7h7
    s[2] = _mm256_unpacklo_epi8(s46, s57);

    // a8b8...a15b15 | c8d8...c15d15
    s[5] = _mm256_unpackhi_epi8(s02, s13);
    // c8d8...c15d15 | e8f8...e15f15
    s[6] = _mm256_unpackhi_epi8(s24, s35);
    // e8f8...e15f15 | g8h8...g15h15
    s[7] = _mm256_unpackhi_epi8(s46, s57);

    // height to be processed here
    const int process_ht = height - remain_row;
    for (int i = 0; i < process_ht; i += 4) {
      PROCESS_RESIZE_Y_WD16

      _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                       CAST_LOW(res_8bit0));

      _mm_storeu_si128(
          (__m128i *)&output[(i / 2) * out_stride + j + out_stride],
          _mm256_extracti128_si256(res_8bit0, 1));

      // Load the required data for processing of next 4 input rows.
      const int idx7 = AOMMIN(height - 1, i + 7);
      const int idx8 = AOMMIN(height - 1, i + 8);
      l10 = _mm_loadu_si128((__m128i *)(data + idx7 * stride));
      l11 = _mm_loadu_si128((__m128i *)(data + idx8 * stride));

      const __m256i s810 =
          _mm256_permute2x128_si256(CAST_HI(l8), CAST_HI(l10), 0x20);
      const __m256i s911 =
          _mm256_permute2x128_si256(CAST_HI(l9), CAST_HI(l11), 0x20);
      // i0j0... i7j7 | k0l0... k7l7
      s[4] = _mm256_unpacklo_epi8(s810, s911);
      // i8j8... i15j15 | k8l8... k15l15
      s[9] = _mm256_unpackhi_epi8(s810, s911);

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];

      s[5] = s[7];
      s[6] = s[8];
      s[7] = s[9];
    }

    // Process the remaining last 4 or 6 rows here.
    int i = process_ht;
    while (i < height - 1) {
      PROCESS_RESIZE_Y_WD16

      _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                       CAST_LOW(res_8bit0));
      i += 2;

      const int is_store_valid = (i < height - 1);
      if (is_store_valid)
        _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                         _mm256_extracti128_si256(res_8bit0, 1));
      i += 2;

      // Check if there is any remaining height to process. If so, perform the
      // necessary data loading for processing the next row.
      if (i < height - 1) {
        l10 = l11 = l9;
        const __m256i s810 =
            _mm256_permute2x128_si256(CAST_HI(l8), CAST_HI(l10), 0x20);
        const __m256i s911 =
            _mm256_permute2x128_si256(CAST_HI(l9), CAST_HI(l11), 0x20);
        // i0j0... i7j7 | k0l0... k7l7
        s[4] = _mm256_unpacklo_epi8(s810, s911);
        // i8j8... i15j15 | k8l8... k15l15
        s[9] = _mm256_unpackhi_epi8(s810, s911);

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];

        s[5] = s[7];
        s[6] = s[8];
        s[7] = s[9];
      }
    }
  }

  if (remain_col > 7) {
    const int processed_wd = num_col16 * 16;
    remain_col = stride % 8;

    const uint8_t *data = &intbuf[processed_wd];

    const __m128i l3 = _mm_loadl_epi64((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with available top-most row.
    const __m128i l0 = l3;
    const __m128i l1 = l3;
    const __m128i l2 = l3;
    const __m128i l4 = _mm_loadl_epi64((__m128i *)(data + 1 * stride));

    __m128i l6, l7, l8, l9;
    __m128i l5 = _mm_loadl_epi64((__m128i *)(data + 2 * stride));
    __m128i l10 = _mm_loadl_epi64((__m128i *)(data + 3 * stride));
    __m128i l11 = _mm_loadl_epi64((__m128i *)(data + 4 * stride));

    // a0b0...a7b7
    const __m128i s01 = _mm_unpacklo_epi8(l0, l1);
    // c0d0...c7d7
    const __m128i s23 = _mm_unpacklo_epi8(l2, l3);
    // e0f0...e7f7
    const __m128i s45 = _mm_unpacklo_epi8(l4, l5);
    // g0h0...g7h7
    __m128i s67 = _mm_unpacklo_epi8(l10, l11);

    // a0b0...a7b7 | c0d0...c7d7
    s[0] = _mm256_permute2x128_si256(CAST_HI(s01), CAST_HI(s23), 0x20);
    // c0d0...c7d7 | e0f0...e7f7
    s[1] = _mm256_permute2x128_si256(CAST_HI(s23), CAST_HI(s45), 0x20);
    // e0f0...e7f7 | g0h0...g7h7
    s[2] = _mm256_permute2x128_si256(CAST_HI(s45), CAST_HI(s67), 0x20);

    // height to be processed here
    const int process_ht = height - remain_row;
    for (int i = 0; i < process_ht; i += 4) {
      PROCESS_RESIZE_Y_WD8

      _mm_storel_epi64((__m128i *)&output[(i / 2) * out_stride + processed_wd],
                       CAST_LOW(res_a_round_1));

      _mm_storel_epi64(
          (__m128i *)&output[(i / 2) * out_stride + processed_wd + out_stride],
          _mm256_extracti128_si256(res_a_round_1, 1));

      const int idx7 = AOMMIN(height - 1, i + 7);
      const int idx8 = AOMMIN(height - 1, i + 8);
      l10 = _mm_loadl_epi64((__m128i *)(data + idx7 * stride));
      l11 = _mm_loadl_epi64((__m128i *)(data + idx8 * stride));

      // k0l0... k7l7
      const __m128i s10s11 = _mm_unpacklo_epi8(l10, l11);
      // i0j0... i7j7 | k0l0... k7l7
      s[4] = _mm256_permute2x128_si256(CAST_HI(s89), CAST_HI(s10s11), 0x20);

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
    }

    // Process the remaining last 4 or 6 rows here.
    int i = process_ht;
    while (i < height - 1) {
      PROCESS_RESIZE_Y_WD8

      _mm_storel_epi64((__m128i *)&output[(i / 2) * out_stride + processed_wd],
                       CAST_LOW(res_a_round_1));

      i += 2;

      const int is_store_valid = (i < height - 1);
      if (is_store_valid)
        _mm_storel_epi64(
            (__m128i *)&output[(i / 2) * out_stride + processed_wd],
            _mm256_extracti128_si256(res_a_round_1, 1));
      i += 2;

      // Check rows are still remaining for processing. If yes do the required
      // load of data for the next iteration.
      if (i < height - 1) {
        l10 = l11 = l9;
        // k0l0... k7l7
        const __m128i s10s11 = _mm_unpacklo_epi8(l10, l11);
        // i0j0... i7j7 | k0l0... k7l7
        s[4] = _mm256_permute2x128_si256(CAST_HI(s89), CAST_HI(s10s11), 0x20);

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
      }
    }
  }

  if (remain_col)
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, stride - remain_col);

  return true;
}